

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

void __thiscall icu_63::LocDataParser::skipWhitespace(LocDataParser *this)

{
  UBool UVar1;
  bool bVar2;
  UChar local_1c;
  LocDataParser *this_local;
  
  while( true ) {
    bVar2 = false;
    if (this->p < this->e) {
      if (this->ch == L'\xffff') {
        local_1c = *this->p;
      }
      else {
        local_1c = this->ch;
      }
      UVar1 = PatternProps::isWhiteSpace((uint)(ushort)local_1c);
      bVar2 = UVar1 != '\0';
    }
    if (!bVar2) break;
    inc(this);
  }
  return;
}

Assistant:

inline void skipWhitespace(void) {
        while (p < e && PatternProps::isWhiteSpace(ch != 0xffff ? ch : *p)) {
            inc();
        }
    }